

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O1

String * __thiscall
Corrade::Utility::
format<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*,Corrade::Containers::String,Corrade::Containers::BasicStringView<char>>
          (String *__return_storage_ptr__,Utility *this,char *format,
          BasicStringView<const_char> *args,BasicStringView<const_char> *args_1,
          BasicStringView<const_char> *args_2,String *args_3,BasicStringView<const_char> *args_4,
          BasicStringView<const_char> *args_5,BasicStringView<const_char> *args_6,
          unsigned_long *args_7,char **args_8)

{
  size_t sVar1;
  char *data;
  MutableStringView local_40;
  
  local_40._data = (char *)0x0;
  local_40._sizePlusFlags = 0x8000000000000000;
  sVar1 = formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
                    (&local_40,(char *)this,(BasicStringView<const_char> *)format,args,args_1,
                     (String *)args_2,(BasicStringView<const_char> *)args_3,args_4,args_5,
                     (unsigned_long *)args_6,(char **)args_7);
  Containers::String::String(__return_storage_ptr__,sVar1);
  data = Containers::String::data(__return_storage_ptr__);
  Containers::BasicStringView<char>::BasicStringView(&local_40,data,sVar1 + 1,(StringViewFlags)0x0);
  formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
            (&local_40,(char *)this,(BasicStringView<const_char> *)format,args,args_1,
             (String *)args_2,(BasicStringView<const_char> *)args_3,args_4,args_5,
             (unsigned_long *)args_6,(char **)args_7);
  return __return_storage_ptr__;
}

Assistant:

String format(const char* format, const Args&... args) {
    /* Get just the size first. Can't pass just nullptr, because that would
       match the formatInto(std::FILE*) overload, can't pass a String because
       it's guaranteed to always point to a null-terminated char array, even if
       it's empty. */
    const std::size_t size = formatInto(MutableStringView{}, format, args...);
    String string{NoInit, size};
    /* The String is created with an extra byte for the null terminator, but
       since printf() always wants to print the null terminator, we need to
       pass a view *including* the null terminator to it -- which is why we
       have to create the view manually. Once we switch away from printf() this
       workaround can be removed. */
    formatInto(MutableStringView{string.data(), size + 1}, format, args...);
    return string;
}